

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-math.cc
# Opt level: O1

void math_cos_pi_test(void)

{
  bool bVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar3 = 0xfffffe98;
  dVar4 = -360.0;
  do {
    dVar5 = cos((dVar4 * 3.141592653589793) / 180.0);
    dVar6 = dVar4 / 180.0;
    if (0.25 <= ABS(dVar6)) {
      dVar9 = -dVar6;
      if (-dVar6 <= dVar6) {
        dVar9 = dVar6;
      }
      dVar6 = floor(dVar9);
      dVar9 = dVar9 - dVar6;
      bVar1 = 0.5 < dVar9;
      if (0.5 < dVar9) {
        dVar9 = 1.0 - dVar9;
      }
      dVar10 = dVar9 + -0.5;
      dVar7 = 0.0;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        dVar8 = ABS(dVar9);
        if (dVar8 <= 0.5) {
          dVar8 = 0.5;
        }
        dVar7 = 0.0;
        if (dVar8 * 0.0 < ABS(dVar10)) {
          if (dVar9 <= 0.25) {
            dVar7 = cos(dVar9 * 3.141592653589793);
          }
          else {
            dVar7 = sin((0.5 - dVar9) * 3.141592653589793);
          }
          if (((bVar1 ^ (byte)(int)dVar6) & 1) != 0) {
            dVar7 = -dVar7;
          }
        }
      }
    }
    else {
      dVar7 = cos(dVar6 * 3.141592653589793);
    }
    if (8.881784197001252e-16 < ABS(dVar5 - dVar7)) {
      dVar9 = ABS(dVar5);
      dVar10 = ABS(dVar7);
      dVar6 = dVar10;
      if (dVar10 <= dVar9) {
        dVar6 = dVar9;
      }
      if ((double)(~-(ulong)NAN(dVar9) & (ulong)dVar6 | -(ulong)NAN(dVar9) & (ulong)dVar10) *
          8.881784197001252e-16 < ABS(dVar5 - dVar7)) {
        printf("cos(%d degree) differes: ref = %lf, sin_pi = %lf\n",uVar3);
        acutest_check_(0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                       ,0x2d,"%s","0");
      }
    }
    dVar4 = dVar4 + 1.0;
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 != 0x169);
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-math.cc"
                 ,0x30,"%s","1");
  return;
}

Assistant:

void math_cos_pi_test(void) {
  double kPI = math::constants<double>::pi();

  for (int i = -360; i <= 360; i++) {
    double ref_v = std::cos(double(i) * kPI / 180.0);
    double cos_v = math::cos_pi(double(i)/180.0);
    // TODO: dyanmically change eps based on input degree value.
    if (!math::is_close(ref_v, cos_v, 4*std::numeric_limits<double>::epsilon())) {
      printf("cos(%d degree) differes: ref = %lf, sin_pi = %lf\n", i, ref_v, cos_v);
      TEST_CHECK(0);
    }
  }
  TEST_CHECK(1); // ok
}